

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
               *this,int i)

{
  value_type vVar1;
  
  vVar1 = FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
          ::fastAccessDx(&this->left_->fadexpr_,i);
  return vVar1 + (((this->right_->fadexpr_).right_)->dx_).ptr_to_data[i] *
                 (this->right_->fadexpr_).left_.constant_;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i)+right_.fastAccessDx(i);}